

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.h
# Opt level: O1

shared_ptr<entityx::deps::Dependency<A,_B,_C>_> __thiscall
entityx::SystemManager::add<entityx::deps::Dependency<A,B,C>>(SystemManager *this)

{
  Dependency<A,_B,_C> *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  SystemManager *in_RSI;
  shared_ptr<entityx::deps::Dependency<A,_B,_C>_> sVar2;
  shared_ptr<entityx::deps::Dependency<A,_B,_C>_> local_28;
  
  __p = (Dependency<A,_B,_C> *)operator_new(0x48);
  (__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.connections_._M_h.
  _M_buckets = (__buckets_ptr)0x0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.connections_._M_h.
  _M_bucket_count = 0;
  *(undefined8 *)
   &(__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.connections_._M_h.
    _M_rehash_policy = 0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.connections_._M_h.
  _M_rehash_policy._M_next_resize = 0;
  __p->super_System<entityx::deps::Dependency<A,_B,_C>_> =
       (System<entityx::deps::Dependency<A,_B,_C>_>)0x0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver._vptr_BaseReceiver =
       (_func_int **)0x0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.connections_._M_h.
  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.connections_._M_h.
  _M_element_count = 0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.connections_._M_h.
  _M_single_bucket = (__node_base_ptr)0x0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.connections_._M_h.
  _M_buckets = &(__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.
                connections_._M_h._M_single_bucket;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.connections_._M_h.
  _M_bucket_count = 1;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.connections_._M_h.
  _M_rehash_policy._M_max_load_factor = 1.0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.connections_._M_h.
  _M_rehash_policy._M_next_resize = 0;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.connections_._M_h.
  _M_single_bucket = (__node_base_ptr)0x0;
  __p->super_System<entityx::deps::Dependency<A,_B,_C>_> =
       (System<entityx::deps::Dependency<A,_B,_C>_>)&PTR__Dependency_001d2e48;
  (__p->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver._vptr_BaseReceiver =
       (_func_int **)&PTR__Dependency_001d2e80;
  *(Dependency<A,_B,_C> **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<entityx::deps::Dependency<A,B,C>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->entity_manager_,__p);
  local_28.super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = *(element_type **)this;
  local_28.super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->entity_manager_;
  if (local_28.super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.
            super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.
            super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  add<entityx::deps::Dependency<A,B,C>>(in_RSI,&local_28);
  _Var1._M_pi = extraout_RDX;
  if (local_28.super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.
               super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<entityx::deps::Dependency<A,_B,_C>_>)
         sVar2.super___shared_ptr<entityx::deps::Dependency<A,_B,_C>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<S> add(Args && ... args) {
    std::shared_ptr<S> s(new S(std::forward<Args>(args) ...));
    add(s);
    return s;
  }